

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# P2R.cpp
# Opt level: O1

void __thiscall
OpenMD::P2Z::P2Z(P2Z *this,SimInfo *info,string *filename,string *sele1,string *sele2,uint nbins,
                int axis)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  char *pcVar3;
  long *plVar4;
  char *pcVar5;
  stringstream params;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  long *local_1b8;
  long local_1b0;
  long local_1a8;
  long lStack_1a0;
  ios_base local_138 [264];
  
  P2R::P2R(&this->super_P2R,info,filename,sele1,sele2,nbins);
  (this->super_P2R).super_StaticAnalyser._vptr_StaticAnalyser = (_func_int **)&PTR__P2Z_0033af90;
  *(int *)&(this->super_P2R).field_0xd64 = axis;
  (this->axisLabel_)._M_dataplus._M_p = (pointer)&(this->axisLabel_).field_2;
  (this->axisLabel_)._M_string_length = 0;
  (this->axisLabel_).field_2._M_local_buf[0] = '\0';
  pcVar5 = "z";
  if (axis == 1) {
    pcVar5 = "y";
  }
  pcVar3 = "x";
  if (axis != 0) {
    pcVar3 = pcVar5;
  }
  std::__cxx11::string::_M_replace((ulong)&this->axisLabel_,0,(char *)0x0,(ulong)pcVar3);
  std::operator+(&local_1d8,"2nd order Legendre Polynomial Correlation using ",&this->axisLabel_);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1a8 = *plVar4;
    lStack_1a0 = plVar2[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar4;
    local_1b8 = (long *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.analysisType_);
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  paVar1 = &local_1d8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  getPrefix(&local_1d8,filename);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_1d8);
  plVar4 = plVar2 + 2;
  if ((long *)*plVar2 == plVar4) {
    local_1a8 = *plVar4;
    lStack_1a0 = plVar2[3];
    local_1b8 = &local_1a8;
  }
  else {
    local_1a8 = *plVar4;
    local_1b8 = (long *)*plVar2;
  }
  local_1b0 = plVar2[1];
  *plVar2 = (long)plVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.outputFilename_)
  ;
  if (local_1b8 != &local_1a8) {
    operator_delete(local_1b8,local_1a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::_M_assign((string *)&(this->super_P2R).super_StaticAnalyser.paramString_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

P2Z::P2Z(SimInfo* info, const std::string& filename, const std::string& sele1,
           const std::string& sele2, unsigned int nbins, int axis) :
      P2R(info, filename, sele1, sele2, nbins),
      axis_(axis) {
    switch (axis_) {
    case 0:
      axisLabel_ = "x";
      break;
    case 1:
      axisLabel_ = "y";
      break;
    case 2:
    default:
      axisLabel_ = "z";
      break;
    }

    setAnalysisType("2nd order Legendre Polynomial Correlation using " +
                    axisLabel_ + " as reference axis");
    setOutputName(getPrefix(filename) + ".P2Z");
    std::stringstream params;
    const std::string paramString = params.str();
    setParameterString(paramString);
  }